

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
          (Attribute *this,vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *v)

{
  pointer paVar1;
  pointer paVar2;
  optional<std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_> local_30;
  
  if ((v != (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)0x0) &&
     (primvar::PrimVar::
      get_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                (&local_30,&this->_var), local_30.has_value_ == true)) {
    paVar1 = (v->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (v->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_30.contained.data._0_8_;
    (v->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_30.contained._8_8_;
    (v->super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (paVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(paVar1,(long)paVar2 - (long)paVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }